

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeIdxRowid(sqlite3 *db,BtCursor *pCur,i64 *rowid)

{
  u32 uVar1;
  MemValue local_b0;
  Mem v;
  Mem m;
  u32 lenRowid;
  u32 typeRowid;
  u32 szHdr;
  int rc;
  i64 nCellKey;
  i64 *rowid_local;
  BtCursor *pCur_local;
  sqlite3 *db_local;
  
  _szHdr = 0;
  nCellKey = (i64)rowid;
  rowid_local = (i64 *)pCur;
  pCur_local = (BtCursor *)db;
  uVar1 = sqlite3BtreePayloadSize(pCur);
  _szHdr = (ulong)uVar1;
  sqlite3VdbeMemInit((Mem *)&v.xDel,(sqlite3 *)pCur_local,0);
  typeRowid = sqlite3VdbeMemFromBtree((BtCursor *)rowid_local,0,(u32)_szHdr,(Mem *)&v.xDel);
  db_local._4_4_ = typeRowid;
  if (typeRowid == 0) {
    if (*(byte *)m._8_8_ < 0x80) {
      lenRowid = (u32)*(byte *)m._8_8_;
    }
    else {
      sqlite3GetVarint32((uchar *)m._8_8_,&lenRowid);
    }
    if ((2 < lenRowid) && (lenRowid <= (uint)m.u.i._4_4_)) {
      if (*(byte *)(m._8_8_ + (ulong)(lenRowid - 1)) < 0x80) {
        m.xDel._4_4_ = (uint)*(byte *)(m._8_8_ + (ulong)(lenRowid - 1));
      }
      else {
        sqlite3GetVarint32((uchar *)(m._8_8_ + (ulong)(lenRowid - 1)),(u32 *)((long)&m.xDel + 4));
      }
      if ((((m.xDel._4_4_ != 0) && (m.xDel._4_4_ < 10)) && (m.xDel._4_4_ != 7)) &&
         (m.xDel._0_4_ = (uint)""[m.xDel._4_4_], lenRowid + (uint)m.xDel <= (uint)m.u.i._4_4_)) {
        sqlite3VdbeSerialGet
                  ((uchar *)(m._8_8_ + (ulong)(m.u.i._4_4_ - (uint)m.xDel)),m.xDel._4_4_,
                   (Mem *)&local_b0);
        *(MemValue *)nCellKey = local_b0;
        sqlite3VdbeMemRelease((Mem *)&v.xDel);
        return 0;
      }
    }
    sqlite3VdbeMemRelease((Mem *)&v.xDel);
    db_local._4_4_ = sqlite3CorruptError(0x13c80);
  }
  return db_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeIdxRowid(sqlite3 *db, BtCursor *pCur, i64 *rowid){
  i64 nCellKey = 0;
  int rc;
  u32 szHdr;        /* Size of the header */
  u32 typeRowid;    /* Serial type of the rowid */
  u32 lenRowid;     /* Size of the rowid */
  Mem m, v;

  /* Get the size of the index entry.  Only indices entries of less
  ** than 2GiB are support - anything large must be database corruption.
  ** Any corruption is detected in sqlite3BtreeParseCellPtr(), though, so
  ** this code can safely assume that nCellKey is 32-bits  
  */
  assert( sqlite3BtreeCursorIsValid(pCur) );
  nCellKey = sqlite3BtreePayloadSize(pCur);
  assert( (nCellKey & SQLITE_MAX_U32)==(u64)nCellKey );

  /* Read in the complete content of the index entry */
  sqlite3VdbeMemInit(&m, db, 0);
  rc = sqlite3VdbeMemFromBtree(pCur, 0, (u32)nCellKey, &m);
  if( rc ){
    return rc;
  }

  /* The index entry must begin with a header size */
  (void)getVarint32((u8*)m.z, szHdr);
  testcase( szHdr==3 );
  testcase( szHdr==m.n );
  testcase( szHdr>0x7fffffff );
  assert( m.n>=0 );
  if( unlikely(szHdr<3 || szHdr>(unsigned)m.n) ){
    goto idx_rowid_corruption;
  }

  /* The last field of the index should be an integer - the ROWID.
  ** Verify that the last entry really is an integer. */
  (void)getVarint32((u8*)&m.z[szHdr-1], typeRowid);
  testcase( typeRowid==1 );
  testcase( typeRowid==2 );
  testcase( typeRowid==3 );
  testcase( typeRowid==4 );
  testcase( typeRowid==5 );
  testcase( typeRowid==6 );
  testcase( typeRowid==8 );
  testcase( typeRowid==9 );
  if( unlikely(typeRowid<1 || typeRowid>9 || typeRowid==7) ){
    goto idx_rowid_corruption;
  }
  lenRowid = sqlite3SmallTypeSizes[typeRowid];
  testcase( (u32)m.n==szHdr+lenRowid );
  if( unlikely((u32)m.n<szHdr+lenRowid) ){
    goto idx_rowid_corruption;
  }

  /* Fetch the integer off the end of the index record */
  sqlite3VdbeSerialGet((u8*)&m.z[m.n-lenRowid], typeRowid, &v);
  *rowid = v.u.i;
  sqlite3VdbeMemRelease(&m);
  return SQLITE_OK;

  /* Jump here if database corruption is detected after m has been
  ** allocated.  Free the m object and return SQLITE_CORRUPT. */
idx_rowid_corruption:
  testcase( m.szMalloc!=0 );
  sqlite3VdbeMemRelease(&m);
  return SQLITE_CORRUPT_BKPT;
}